

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonemeta.cpp
# Opt level: O0

UVector * icu_63::ZoneMeta::getMetazoneMappings(UnicodeString *tzid)

{
  UnicodeString *this;
  UBool UVar1;
  int32_t iVar2;
  Char16Ptr local_168;
  char16_t *local_160;
  UChar *key;
  UVector *pUStack_150;
  int32_t tzidLen;
  UVector *tmpResult;
  UVector *result;
  Char16Ptr local_130;
  char16_t local_128 [4];
  UChar tzidUChars [129];
  UErrorCode local_1c;
  UnicodeString *pUStack_18;
  UErrorCode status;
  UnicodeString *tzid_local;
  
  local_1c = U_ZERO_ERROR;
  pUStack_18 = tzid;
  Char16Ptr::Char16Ptr(&local_130,local_128);
  UnicodeString::extract(tzid,&local_130,0x81,&local_1c);
  Char16Ptr::~Char16Ptr(&local_130);
  UVar1 = ::U_FAILURE(local_1c);
  if ((UVar1 == '\0') && (local_1c != U_STRING_NOT_TERMINATED_WARNING)) {
    umtx_initOnce(&gOlsonToMetaInitOnce,olsonToMetaInit,&local_1c);
    UVar1 = ::U_FAILURE(local_1c);
    if (UVar1 == '\0') {
      tmpResult = (UVector *)0x0;
      umtx_lock_63(&gZoneMetaLock);
      tmpResult = (UVector *)uhash_get_63(gOlsonToMeta,local_128);
      umtx_unlock_63(&gZoneMetaLock);
      if (tmpResult == (UVector *)0x0) {
        pUStack_150 = createMetazoneMappings(pUStack_18);
        if (pUStack_150 == (UVector *)0x0) {
          tzid_local = (UnicodeString *)0x0;
        }
        else {
          umtx_lock_63(&gZoneMetaLock);
          tmpResult = (UVector *)uhash_get_63(gOlsonToMeta,local_128);
          if (tmpResult == (UVector *)0x0) {
            iVar2 = UnicodeString::length(pUStack_18);
            key._4_4_ = iVar2 + 1;
            local_160 = (char16_t *)uprv_malloc_63((long)key._4_4_ << 1);
            this = pUStack_18;
            if (local_160 == (char16_t *)0x0) {
              tmpResult = (UVector *)0x0;
              if (pUStack_150 != (UVector *)0x0) {
                (*(pUStack_150->super_UObject)._vptr_UObject[1])();
              }
            }
            else {
              Char16Ptr::Char16Ptr(&local_168,local_160);
              UnicodeString::extract(this,&local_168,key._4_4_,&local_1c);
              Char16Ptr::~Char16Ptr(&local_168);
              uhash_put_63(gOlsonToMeta,local_160,pUStack_150,&local_1c);
              UVar1 = ::U_FAILURE(local_1c);
              if (UVar1 == '\0') {
                tmpResult = pUStack_150;
              }
              else {
                tmpResult = (UVector *)0x0;
                if (pUStack_150 != (UVector *)0x0) {
                  (*(pUStack_150->super_UObject)._vptr_UObject[1])();
                }
              }
            }
          }
          else if (pUStack_150 != (UVector *)0x0) {
            (*(pUStack_150->super_UObject)._vptr_UObject[1])();
          }
          umtx_unlock_63(&gZoneMetaLock);
          tzid_local = (UnicodeString *)tmpResult;
        }
      }
      else {
        tzid_local = (UnicodeString *)tmpResult;
      }
    }
    else {
      tzid_local = (UnicodeString *)0x0;
    }
  }
  else {
    tzid_local = (UnicodeString *)0x0;
  }
  return (UVector *)tzid_local;
}

Assistant:

const UVector* U_EXPORT2
ZoneMeta::getMetazoneMappings(const UnicodeString &tzid) {
    UErrorCode status = U_ZERO_ERROR;
    UChar tzidUChars[ZID_KEY_MAX + 1];
    tzid.extract(tzidUChars, ZID_KEY_MAX + 1, status);
    if (U_FAILURE(status) || status == U_STRING_NOT_TERMINATED_WARNING) {
        return NULL;
    }

    umtx_initOnce(gOlsonToMetaInitOnce, &olsonToMetaInit, status);
    if (U_FAILURE(status)) {
        return NULL;
    }

    // get the mapping from cache
    const UVector *result = NULL;

    umtx_lock(&gZoneMetaLock);
    {
        result = (UVector*) uhash_get(gOlsonToMeta, tzidUChars);
    }
    umtx_unlock(&gZoneMetaLock);

    if (result != NULL) {
        return result;
    }

    // miss the cache - create new one
    UVector *tmpResult = createMetazoneMappings(tzid);
    if (tmpResult == NULL) {
        // not available
        return NULL;
    }

    // put the new one into the cache
    umtx_lock(&gZoneMetaLock);
    {
        // make sure it's already created
        result = (UVector*) uhash_get(gOlsonToMeta, tzidUChars);
        if (result == NULL) {
            // add the one just created
            int32_t tzidLen = tzid.length() + 1;
            UChar *key = (UChar*)uprv_malloc(tzidLen * sizeof(UChar));
            if (key == NULL) {
                // memory allocation error..  just return NULL
                result = NULL;
                delete tmpResult;
            } else {
                tzid.extract(key, tzidLen, status);
                uhash_put(gOlsonToMeta, key, tmpResult, &status);
                if (U_FAILURE(status)) {
                    // delete the mapping
                    result = NULL;
                    delete tmpResult;
                } else {
                    result = tmpResult;
                }
            }
        } else {
            // another thread already put the one
            delete tmpResult;
        }
    }
    umtx_unlock(&gZoneMetaLock);

    return result;
}